

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_first<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  uint uVar1;
  example *peVar2;
  reference ppeVar3;
  size_t sVar4;
  action_score *paVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  uint64_t unaff_retaddr;
  multi_ex *in_stack_00000008;
  multi_learner *in_stack_00000010;
  size_t i_1;
  size_t i;
  float prob;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  multi_ex *in_stack_000004f0;
  action_scores *in_stack_ffffffffffffffa8;
  ulong local_38;
  score_iterator *in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd8;
  float fVar6;
  v_array<ACTION_SCORE::action_score> *this;
  
  if (*(float *)(in_RDI + 0x120) <= 1.0 && *(float *)(in_RDI + 0x120) != 1.0) {
    peVar2 = test_adf_sequence(in_stack_000004f0);
    if (peVar2 != (example *)0x0) {
      LEARNER::multiline_learn_or_predict<true>
                (in_stack_00000010,in_stack_00000008,unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20)
                );
      goto LAB_003aaf05;
    }
  }
  LEARNER::multiline_learn_or_predict<true>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
LAB_003aaf05:
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  this = (v_array<ACTION_SCORE::action_score> *)&(*ppeVar3)->pred;
  sVar4 = v_array<ACTION_SCORE::action_score>::size(this);
  uVar1 = (uint)sVar4;
  if (*(long *)(in_RDI + 0x58) == 0) {
    for (local_38 = 1; local_38 < uVar1; local_38 = local_38 + 1) {
      paVar5 = v_array<ACTION_SCORE::action_score>::operator[](this,local_38);
      paVar5->score = 0.0;
    }
    paVar5 = v_array<ACTION_SCORE::action_score>::operator[](this,0);
    paVar5->score = 1.0;
  }
  else {
    in_stack_ffffffffffffffd8 = 1.0 / (float)(sVar4 & 0xffffffff);
    for (in_stack_ffffffffffffffd0 = (score_iterator *)0x0;
        in_stack_ffffffffffffffd0 < (score_iterator *)(ulong)uVar1;
        in_stack_ffffffffffffffd0 =
             (score_iterator *)((long)&in_stack_ffffffffffffffd0->_vptr_score_iterator + 1)) {
      fVar6 = in_stack_ffffffffffffffd8;
      paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                         (this,(size_t)in_stack_ffffffffffffffd0);
      paVar5->score = in_stack_ffffffffffffffd8;
      in_stack_ffffffffffffffd8 = fVar6;
    }
    *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + -1;
  }
  ACTION_SCORE::begin_scores(in_stack_ffffffffffffffa8);
  ACTION_SCORE::end_scores(in_stack_ffffffffffffffa8);
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            ((float)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0),
             (score_iterator *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void predict_or_learn_first(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Explore tau times, then act according to optimal.
  if (is_learn && data.gen_cs.known_cost.probability < 1 && test_adf_sequence(examples) != nullptr)
    multiline_learn_or_predict<true>(base, examples, data.offset);
  else
    multiline_learn_or_predict<true>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)preds.size();

  if (data.tau)
  {
    float prob = 1.f / (float)num_actions;
    for (size_t i = 0; i < num_actions; i++) preds[i].score = prob;
    data.tau--;
  }
  else
  {
    for (size_t i = 1; i < num_actions; i++) preds[i].score = 0.;
    preds[0].score = 1.0;
  }

  enforce_minimum_probability(data.epsilon, true, begin_scores(preds), end_scores(preds));
}